

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

char * btorsim_bv_to_hex_char(BtorSimBitVector *bv)

{
  uint32_t uVar1;
  BtorSimBitVector *pBVar2;
  uint3 uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  BtorSimBitVector *a;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  char cVar12;
  uint uVar13;
  uint *__nmemb;
  size_t __size;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  char *pcVar17;
  bool bVar18;
  char *pcStack_68;
  BtorSimBitVector *pBStack_60;
  BtorSimBitVector *pBStack_58;
  BtorSimBitVector *pBStack_50;
  BtorSimBitVector *pBStack_48;
  
  uVar4 = bv->width;
  uVar16 = uVar4 + 3 >> 2;
  uVar6 = (ulong)uVar16;
  __nmemb = (uint *)(ulong)(uVar16 + 1);
  pcVar5 = (char *)calloc((size_t)__nmemb,1);
  if (pcVar5 != (char *)0x0) {
    if (uVar4 != 0) {
      uVar1 = bv->len;
      uVar16 = 0;
      do {
        bVar18 = ((&bv[1].width)[~(uVar16 >> 5) + uVar1] >> (uVar16 & 0x1f) & 1) != 0;
        uVar13 = (uint)bVar18;
        uVar16 = uVar16 + 1;
        if (uVar16 < uVar4) {
          uVar8 = 1;
          uVar13 = (uint)bVar18;
          do {
            uVar13 = (uint)(((&bv[1].width)[~(uVar16 >> 5) + uVar1] >> (uVar16 & 0x1f) & 1) != 0) <<
                     ((byte)uVar8 & 0x1f) | uVar13;
            uVar16 = uVar16 + 1;
            if (uVar4 <= uVar16) break;
            bVar18 = uVar8 < 3;
            uVar8 = uVar8 + 1;
          } while (bVar18);
        }
        uVar6 = (ulong)((int)uVar6 - 1);
        bVar11 = (byte)uVar13 + 0x57;
        if (uVar13 < 10) {
          bVar11 = (byte)uVar13 | 0x30;
        }
        pcVar5[uVar6] = bVar11;
      } while (uVar16 < uVar4);
    }
    return pcVar5;
  }
  btorsim_bv_to_hex_char_cold_1();
  uVar6 = (ulong)__nmemb[1];
  pBStack_48 = bv;
  if (uVar6 == 0) {
LAB_00113baa:
    pcStack_68 = (char *)0x2;
    pcVar5 = (char *)calloc(2,1);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '0';
      return pcVar5;
    }
LAB_00113df2:
    btorsim_bv_to_dec_char_cold_4();
    pcVar14 = pcStack_68;
  }
  else {
    if (__nmemb[2] == 0) {
      uVar9 = 1;
      do {
        uVar10 = uVar9;
        if (uVar6 == uVar10) break;
        uVar9 = uVar10 + 1;
      } while (__nmemb[uVar10 + 2] == 0);
      if (uVar6 <= uVar10) goto LAB_00113baa;
    }
    if (*__nmemb < 4) {
      pBStack_58 = btorsim_bv_uint64_to_bv(10,4);
      a = btorsim_bv_new(4);
      uVar6 = (ulong)__nmemb[1];
      pBVar2 = (BtorSimBitVector *)((long)a + uVar6 * -4 + (ulong)a->len * 4);
    }
    else {
      pBStack_58 = btorsim_bv_uint64_to_bv(10,*__nmemb);
      a = btorsim_bv_new(*__nmemb);
      uVar6 = (ulong)__nmemb[1];
      pBVar2 = a;
    }
    memcpy(pBVar2 + 1,__nmemb + 2,uVar6 << 2);
    uVar4 = a->len;
    if (uVar4 != 0) {
      pcStack_68 = (char *)0x0;
      pcVar5 = (char *)0x0;
      pcVar14 = (char *)0x0;
LAB_00113c17:
      pBVar2 = pBStack_58;
      if (a[1].width == 0) {
        uVar6 = 1;
        do {
          uVar9 = uVar6;
          if (uVar4 == uVar9) break;
          uVar6 = uVar9 + 1;
        } while ((&a[1].width)[uVar9] == 0);
        if (uVar4 <= uVar9) goto LAB_00113d57;
      }
      pBStack_60 = (BtorSimBitVector *)0x0;
      udiv_urem_bv(a,pBStack_58,&pBStack_60,(BtorSimBitVector **)0x0);
      pBStack_50 = pBStack_60;
      pBStack_60 = (BtorSimBitVector *)0x0;
      udiv_urem_bv(a,pBVar2,(BtorSimBitVector **)0x0,&pBStack_60);
      pBVar2 = pBStack_60;
      uVar4 = pBStack_60->width;
LAB_00113c8c:
      uVar4 = uVar4 - 1;
      cVar12 = '0';
      if (uVar4 != 0xffffffff) {
        if (((&pBStack_60[1].width)[~(uVar4 >> 5) + pBStack_60->len] >> (uVar4 & 0x1f) & 1) == 0)
        goto code_r0x00113ca9;
        bVar11 = 0;
        do {
          bVar11 = ((&pBStack_60[1].width)[~(uVar4 >> 5) + pBStack_60->len] >> (uVar4 & 0x1f) & 1)
                   != 0 | bVar11 * '\x02';
          bVar18 = uVar4 != 0;
          uVar4 = uVar4 - 1;
        } while (bVar18);
        cVar12 = bVar11 + 0x30;
      }
      goto LAB_00113cdc;
    }
    pcVar14 = (char *)0x0;
    pcVar5 = (char *)0x0;
    pcStack_68 = (char *)0x0;
LAB_00113d57:
    free(a);
    free(pBStack_58);
    if (pcVar5 == pcStack_68) {
      if ((pcVar5 == pcVar14) &&
         (pcVar14 = pcStack_68, pcStack_68 = (char *)realloc(pcStack_68,1), pcVar5 = pcStack_68,
         pcStack_68 == (char *)0x0)) goto LAB_00113dfc;
      *pcVar5 = '0';
      pcVar5 = pcVar5 + 1;
    }
    pcVar14 = pcVar5 + (1 - (long)pcStack_68);
    if (pcVar14 == (char *)0x0) {
      pcVar7 = (char *)0x0;
      pcVar17 = pcVar7;
joined_r0x00113dba:
      for (; pcStack_68 < pcVar5; pcVar5 = pcVar5 + -1) {
        *pcVar7 = pcVar5[-1];
        pcVar7 = pcVar7 + 1;
      }
      *pcVar7 = '\0';
      free(pcStack_68);
      return pcVar17;
    }
    pcVar7 = (char *)malloc((size_t)pcVar14);
    pcVar17 = pcVar7;
    if (pcVar7 != (char *)0x0) goto joined_r0x00113dba;
  }
  btorsim_bv_to_dec_char_cold_2();
LAB_00113dfc:
  btorsim_bv_to_dec_char_cold_3();
  uVar6 = (ulong)*(uint *)(pcVar14 + 4);
  uVar3 = (uint3)(*(uint *)(pcVar14 + 4) >> 8);
  if (uVar6 == 0) {
    return (char *)CONCAT71((uint7)uVar3,1);
  }
  if (*(int *)(pcVar14 + 8) != 0) {
    return (char *)0x0;
  }
  uVar9 = 1;
  do {
    uVar10 = uVar9;
    if (uVar6 == uVar10) break;
    uVar9 = uVar10 + 1;
  } while (*(int *)(pcVar14 + uVar10 * 4 + 8) == 0);
  return (char *)(ulong)CONCAT31(uVar3,uVar6 <= uVar10);
code_r0x00113ca9:
  if (uVar4 == 0) goto LAB_00113cdc;
  goto LAB_00113c8c;
LAB_00113cdc:
  if (pcVar5 == pcVar14) {
    __size = ((long)pcVar5 - (long)pcStack_68) * 2;
    lVar15 = (long)pcVar5 - (long)pcStack_68;
    if (lVar15 == 0) {
      __size = 1;
    }
    pcVar7 = (char *)realloc(pcStack_68,__size);
    if (pcVar7 != (char *)0x0) {
      pcVar5 = pcVar7 + lVar15;
      pcVar14 = pcVar7 + __size;
      pcStack_68 = pcVar7;
      goto LAB_00113d17;
    }
    btorsim_bv_to_dec_char_cold_1();
    goto LAB_00113df2;
  }
LAB_00113d17:
  *pcVar5 = cVar12;
  pcVar5 = pcVar5 + 1;
  free(pBVar2);
  free(a);
  uVar4 = pBStack_50->len;
  a = pBStack_50;
  if (uVar4 == 0) goto LAB_00113d57;
  goto LAB_00113c17;
}

Assistant:

char *
btorsim_bv_to_hex_char (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t len, i, j, k, tmp;
  char *res, ch;

  len = (bv->width + 3) / 4;
  BTOR2_CNEWN (res, len + 1);
  for (i = 0, j = len - 1; i < bv->width;)
  {
    tmp = btorsim_bv_get_bit (bv, i++);
    for (k = 1; i < bv->width && k <= 3; i++, k++)
      tmp |= btorsim_bv_get_bit (bv, i) << k;
    ch       = tmp < 10 ? '0' + tmp : 'a' + (tmp - 10);
    res[j--] = ch;
  }

  return res;
}